

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMiMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar2;
  BVH *bvh;
  size_t sVar3;
  Geometry *pGVar4;
  long lVar5;
  RTCFilterFunctionN p_Var6;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  ulong uVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  vbool<4> vVar20;
  uint uVar21;
  undefined4 uVar22;
  int iVar23;
  AABBNodeMB4D *node1;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  QuadMesh *mesh;
  NodeRef root;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  uint uVar31;
  ulong uVar32;
  long lVar33;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar34;
  NodeRef *pNVar35;
  bool bVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 in_ZMM0 [64];
  float fVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar69;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar67;
  float fVar68;
  undefined1 auVar66 [64];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [64];
  vint4 ai;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  anon_union_16_2_9473010e_for_vint_impl<4>_1 aVar87;
  float fVar88;
  float fVar89;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  vint4 ai_1;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar103;
  undefined1 auVar98 [16];
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar123;
  float fVar128;
  vint4 ai_3;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar138;
  float fVar149;
  float fVar150;
  vint4 bi;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar151;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar152;
  float fVar162;
  float fVar163;
  vint4 ai_2;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar164;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar165;
  float fVar174;
  float fVar175;
  vint4 bi_1;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  float fVar176;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  vint4 bi_3;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [64];
  vint4 bi_2;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  float fVar186;
  uint uVar188;
  float fVar189;
  uint uVar190;
  float fVar191;
  undefined1 auVar187 [16];
  uint uVar192;
  float fVar193;
  float fVar194;
  float fVar197;
  float fVar198;
  undefined1 auVar195 [16];
  float fVar199;
  undefined1 auVar196 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 in_ZMM13 [64];
  float fVar204;
  float fVar207;
  float fVar208;
  undefined1 auVar205 [16];
  float fVar209;
  undefined1 auVar206 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [64];
  vuint<4> *v;
  Precalculations pre;
  vint<4> itime;
  Vec3<embree::vfloat_impl<4>_> p1;
  undefined8 local_19e8;
  undefined8 uStack_19e0;
  undefined8 local_19d8;
  undefined8 uStack_19d0;
  vbool<4> terminated;
  Vec3<embree::vfloat_impl<4>_> p0;
  undefined1 local_1908 [8];
  float fStack_1900;
  float fStack_18fc;
  undefined1 local_18f8 [8];
  float fStack_18f0;
  float fStack_18ec;
  undefined8 local_18a8;
  undefined8 uStack_18a0;
  undefined8 local_1898;
  undefined8 uStack_1890;
  undefined1 local_1868 [8];
  float fStack_1860;
  float fStack_185c;
  TravRayK<4,_false> tray;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  undefined1 auVar185 [64];
  
  uVar19 = mm_lookupmask_ps._248_8_;
  uVar18 = mm_lookupmask_ps._240_8_;
  uVar17 = mm_lookupmask_ps._8_8_;
  uVar16 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    auVar55 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar72 = vpcmpeqd_avx(auVar55,(undefined1  [16])valid_i->field_0);
    auVar70 = ZEXT816(0) << 0x40;
    auVar8 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar70,5);
    auVar71 = auVar72 & auVar8;
    if ((((auVar71 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar71 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar71 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar71[0xf] < '\0')
    {
      auVar8 = vandps_avx(auVar8,auVar72);
      tray.org.field_0._0_4_ = *(float *)ray;
      tray.org.field_0._4_4_ = *(float *)(ray + 4);
      tray.org.field_0._8_4_ = *(float *)(ray + 8);
      tray.org.field_0._12_4_ = *(float *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(float *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(float *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(float *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(float *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(float *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(float *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(float *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(float *)(ray + 0x2c);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar195._8_4_ = 0x7fffffff;
      auVar195._0_8_ = 0x7fffffff7fffffff;
      auVar195._12_4_ = 0x7fffffff;
      auVar72 = vandps_avx(auVar195,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar181._8_4_ = 0x219392ef;
      auVar181._0_8_ = 0x219392ef219392ef;
      auVar181._12_4_ = 0x219392ef;
      auVar72 = vcmpps_avx(auVar72,auVar181,1);
      auVar71 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar181,auVar72)
      ;
      auVar72 = vandps_avx(auVar195,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar72 = vcmpps_avx(auVar72,auVar181,1);
      auVar90 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar181,auVar72)
      ;
      auVar72 = vandps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar195);
      auVar72 = vcmpps_avx(auVar72,auVar181,1);
      auVar72 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar181,auVar72)
      ;
      auVar91 = vrcpps_avx(auVar71);
      auVar182._8_4_ = 0x3f800000;
      auVar182._0_8_ = 0x3f8000003f800000;
      auVar182._12_4_ = 0x3f800000;
      auVar185 = ZEXT1664(auVar182);
      auVar71 = vfnmadd213ps_fma(auVar71,auVar91,auVar182);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar71,auVar91,auVar91)
      ;
      auVar71 = vrcpps_avx(auVar90);
      auVar90 = vfnmadd213ps_fma(auVar90,auVar71,auVar182);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar90,auVar71,auVar71)
      ;
      auVar71 = vrcpps_avx(auVar72);
      auVar180 = ZEXT1664(auVar71);
      auVar72 = vfnmadd213ps_fma(auVar72,auVar71,auVar182);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar72,auVar71,auVar71)
      ;
      tray.org_rdir.field_0._0_4_ = tray.rdir.field_0._0_4_ * *(float *)ray;
      tray.org_rdir.field_0._4_4_ = tray.rdir.field_0._4_4_ * *(float *)(ray + 4);
      tray.org_rdir.field_0._8_4_ = tray.rdir.field_0._8_4_ * *(float *)(ray + 8);
      tray.org_rdir.field_0._12_4_ = tray.rdir.field_0._12_4_ * *(float *)(ray + 0xc);
      tray.org_rdir.field_0._16_4_ = *(float *)(ray + 0x10) * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = *(float *)(ray + 0x14) * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = *(float *)(ray + 0x18) * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = *(float *)(ray + 0x1c) * tray.rdir.field_0._28_4_;
      tray.org_rdir.field_0._32_4_ = *(float *)(ray + 0x20) * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = *(float *)(ray + 0x24) * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = *(float *)(ray + 0x28) * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = *(float *)(ray + 0x2c) * tray.rdir.field_0._44_4_;
      auVar72 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar70,1);
      auVar71._8_4_ = 0x10;
      auVar71._0_8_ = 0x1000000010;
      auVar71._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar72,auVar71);
      auVar72 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar70,5);
      auVar90._8_4_ = 0x20;
      auVar90._0_8_ = 0x2000000020;
      auVar90._12_4_ = 0x20;
      auVar110._8_4_ = 0x30;
      auVar110._0_8_ = 0x3000000030;
      auVar110._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar110,auVar90,auVar72)
      ;
      auVar72 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar70,5);
      auVar91._8_4_ = 0x40;
      auVar91._0_8_ = 0x4000000040;
      auVar91._12_4_ = 0x40;
      auVar111._8_4_ = 0x50;
      auVar111._0_8_ = 0x5000000050;
      auVar111._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar111,auVar91,auVar72)
      ;
      auVar72 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar70);
      auVar71 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar70);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar215 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar72,auVar8);
      auVar72._8_4_ = 0xff800000;
      auVar72._0_8_ = 0xff800000ff800000;
      auVar72._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar72,auVar71,auVar8);
      terminated.field_0.i[1] = auVar8._4_4_ ^ auVar55._4_4_;
      terminated.field_0.i[0] = auVar8._0_4_ ^ auVar55._0_4_;
      terminated.field_0.i[2] = auVar8._8_4_ ^ auVar55._8_4_;
      terminated.field_0.i[3] = auVar8._12_4_ ^ auVar55._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar31 = 3;
      }
      else {
        uVar31 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      pNVar35 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar34 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar55 = vpcmpeqd_avx((undefined1  [16])tray.tnear.field_0,
                             (undefined1  [16])tray.tnear.field_0);
      auVar66 = ZEXT1664(auVar55);
LAB_004e1d8f:
      do {
        do {
          root.ptr = pNVar35[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_004e31c3;
          pNVar35 = pNVar35 + -1;
          paVar34 = paVar34 + -1;
          aVar2 = *paVar34;
          auVar55 = vcmpps_avx((undefined1  [16])aVar2,(undefined1  [16])tray.tfar.field_0,1);
          uVar21 = vmovmskps_avx(auVar55);
        } while (uVar21 == 0);
        uVar24 = (ulong)(uVar21 & 0xff);
        uVar21 = POPCOUNT(uVar21 & 0xff);
        if (uVar31 < uVar21) {
LAB_004e1dcd:
          vVar20.field_0 = terminated.field_0;
          auVar81 = ZEXT1664((undefined1  [16])aVar2);
          do {
            auVar55 = auVar66._0_16_;
            uVar21 = (uint)root.ptr;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_004e31c3;
              auVar72 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar81._0_16_,6);
              if ((((auVar72 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar72 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar72 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar72[0xf] < '\0') {
                uVar24 = (ulong)(uVar21 & 0xf);
                if (uVar24 != 8) {
                  uVar25 = 0;
                  auVar72 = (undefined1  [16])terminated.field_0 ^ auVar55;
                  do {
                    lVar26 = uVar25 * 0x60 + (root.ptr & 0xfffffffffffffff0);
                    uVar21 = vmovmskps_avx(auVar72);
                    uVar12 = 0;
                    uVar32 = (ulong)uVar21;
                    for (uVar27 = uVar32; (uVar27 & 1) == 0;
                        uVar27 = uVar27 >> 1 | 0x8000000000000000) {
                      uVar12 = uVar12 + 1;
                    }
                    auVar81 = ZEXT1664(auVar72);
                    uVar27 = 0;
                    while( true ) {
                      auVar210 = auVar215._0_16_;
                      auVar200 = in_ZMM13._0_16_;
                      auVar71 = auVar81._0_16_;
                      auVar178 = auVar180._0_16_;
                      auVar183 = auVar185._0_16_;
                      if (*(int *)(lVar26 + 0x50 + uVar27 * 4) == -1) break;
                      pGVar4 = (context->scene->geometries).items
                               [*(uint *)(lVar26 + 0x40 + uVar27 * 4)].ptr;
                      fVar89 = (pGVar4->time_range).lower;
                      auVar37._4_4_ = fVar89;
                      auVar37._0_4_ = fVar89;
                      auVar37._8_4_ = fVar89;
                      auVar37._12_4_ = fVar89;
                      fVar100 = pGVar4->fnumTimeSegments;
                      auVar9 = vsubps_avx(*(undefined1 (*) [16])(ray + 0x70),auVar37);
                      fVar89 = (pGVar4->time_range).upper - fVar89;
                      auVar38._4_4_ = fVar89;
                      auVar38._0_4_ = fVar89;
                      auVar38._8_4_ = fVar89;
                      auVar38._12_4_ = fVar89;
                      auVar55 = vdivps_avx(auVar9,auVar38);
                      auVar39._0_4_ = fVar100 * auVar55._0_4_;
                      auVar39._4_4_ = fVar100 * auVar55._4_4_;
                      auVar39._8_4_ = fVar100 * auVar55._8_4_;
                      auVar39._12_4_ = fVar100 * auVar55._12_4_;
                      auVar55 = vroundps_avx(auVar39,1);
                      fVar100 = fVar100 + -1.0;
                      auVar73._4_4_ = fVar100;
                      auVar73._0_4_ = fVar100;
                      auVar73._8_4_ = fVar100;
                      auVar73._12_4_ = fVar100;
                      auVar55 = vminps_avx(auVar55,auVar73);
                      auVar55 = vmaxps_avx(auVar55,_DAT_01f7aa10);
                      auVar70 = vsubps_avx(auVar39,auVar55);
                      itime.field_0 =
                           (anon_union_16_2_9473010e_for_vint_impl<4>_1)vcvtps2dq_avx(auVar55);
                      iVar23 = itime.field_0.i[uVar12];
                      auVar74._4_4_ = iVar23;
                      auVar74._0_4_ = iVar23;
                      auVar74._8_4_ = iVar23;
                      auVar74._12_4_ = iVar23;
                      auVar55 = vpcmpeqd_avx(auVar74,(undefined1  [16])itime.field_0);
                      auVar55 = auVar72 & ~auVar55;
                      fVar100 = auVar70._4_4_;
                      fVar102 = auVar70._8_4_;
                      fVar104 = auVar70._12_4_;
                      fVar89 = auVar70._0_4_;
                      if ((((auVar55 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                           (auVar55 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar55 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          -1 < auVar55[0xf]) {
                        lVar5 = *(long *)(*(long *)&pGVar4[2].numPrimitives + (long)iVar23 * 0x38);
                        lVar33 = *(long *)(*(long *)&pGVar4[2].numPrimitives + 0x38 +
                                          (long)iVar23 * 0x38);
                        uVar28 = (ulong)*(uint *)(lVar26 + uVar27 * 4);
                        uVar30 = (ulong)*(uint *)(lVar26 + 0x10 + uVar27 * 4);
                        uVar22 = *(undefined4 *)(lVar5 + uVar28 * 4);
                        auVar115._4_4_ = uVar22;
                        auVar115._0_4_ = uVar22;
                        auVar115._8_4_ = uVar22;
                        auVar115._12_4_ = uVar22;
                        uVar22 = *(undefined4 *)(lVar5 + 4 + uVar28 * 4);
                        auVar141._4_4_ = uVar22;
                        auVar141._0_4_ = uVar22;
                        auVar141._8_4_ = uVar22;
                        auVar141._12_4_ = uVar22;
                        uVar22 = *(undefined4 *)(lVar5 + 8 + uVar28 * 4);
                        auVar156._4_4_ = uVar22;
                        auVar156._0_4_ = uVar22;
                        auVar156._8_4_ = uVar22;
                        auVar156._12_4_ = uVar22;
                        fVar56 = *(float *)(lVar33 + uVar28 * 4);
                        fVar67 = *(float *)(lVar33 + 4 + uVar28 * 4);
                        fVar68 = *(float *)(lVar33 + 8 + uVar28 * 4);
                        auVar57._8_4_ = 0x3f800000;
                        auVar57._0_8_ = 0x3f8000003f800000;
                        auVar57._12_4_ = 0x3f800000;
                        auVar55 = vsubps_avx(auVar57,auVar70);
                        auVar75._0_4_ = fVar89 * fVar56;
                        auVar75._4_4_ = fVar100 * fVar56;
                        auVar75._8_4_ = fVar102 * fVar56;
                        auVar75._12_4_ = fVar104 * fVar56;
                        auVar83._0_4_ = fVar89 * fVar67;
                        auVar83._4_4_ = fVar100 * fVar67;
                        auVar83._8_4_ = fVar102 * fVar67;
                        auVar83._12_4_ = fVar104 * fVar67;
                        auVar95._0_4_ = fVar89 * fVar68;
                        auVar95._4_4_ = fVar100 * fVar68;
                        auVar95._8_4_ = fVar102 * fVar68;
                        auVar95._12_4_ = fVar104 * fVar68;
                        auVar77 = vfmadd231ps_fma(auVar75,auVar55,auVar115);
                        auVar85 = vfmadd231ps_fma(auVar83,auVar55,auVar141);
                        auVar98 = vfmadd231ps_fma(auVar95,auVar55,auVar156);
                        uVar22 = *(undefined4 *)(lVar5 + uVar30 * 4);
                        auVar116._4_4_ = uVar22;
                        auVar116._0_4_ = uVar22;
                        auVar116._8_4_ = uVar22;
                        auVar116._12_4_ = uVar22;
                        uVar22 = *(undefined4 *)(lVar5 + 4 + uVar30 * 4);
                        auVar142._4_4_ = uVar22;
                        auVar142._0_4_ = uVar22;
                        auVar142._8_4_ = uVar22;
                        auVar142._12_4_ = uVar22;
                        uVar22 = *(undefined4 *)(lVar5 + 8 + uVar30 * 4);
                        auVar157._4_4_ = uVar22;
                        auVar157._0_4_ = uVar22;
                        auVar157._8_4_ = uVar22;
                        auVar157._12_4_ = uVar22;
                        fVar56 = *(float *)(lVar33 + uVar30 * 4);
                        fVar67 = *(float *)(lVar33 + 4 + uVar30 * 4);
                        fVar68 = *(float *)(lVar33 + 8 + uVar30 * 4);
                        auVar201._0_4_ = fVar56 * fVar89;
                        auVar201._4_4_ = fVar56 * fVar100;
                        auVar201._8_4_ = fVar56 * fVar102;
                        auVar201._12_4_ = fVar56 * fVar104;
                        auVar211._0_4_ = fVar67 * fVar89;
                        auVar211._4_4_ = fVar67 * fVar100;
                        auVar211._8_4_ = fVar67 * fVar102;
                        auVar211._12_4_ = fVar67 * fVar104;
                        auVar187._0_4_ = fVar68 * fVar89;
                        auVar187._4_4_ = fVar68 * fVar100;
                        auVar187._8_4_ = fVar68 * fVar102;
                        auVar187._12_4_ = fVar68 * fVar104;
                        auVar196 = vfmadd231ps_fma(auVar201,auVar55,auVar116);
                        auVar214 = vfmadd231ps_fma(auVar211,auVar55,auVar142);
                        auVar206 = vfmadd231ps_fma(auVar187,auVar55,auVar157);
                        uVar28 = (ulong)*(uint *)(lVar26 + 0x20 + uVar27 * 4);
                        uVar22 = *(undefined4 *)(lVar5 + uVar28 * 4);
                        auVar117._4_4_ = uVar22;
                        auVar117._0_4_ = uVar22;
                        auVar117._8_4_ = uVar22;
                        auVar117._12_4_ = uVar22;
                        uVar22 = *(undefined4 *)(lVar5 + 4 + uVar28 * 4);
                        auVar143._4_4_ = uVar22;
                        auVar143._0_4_ = uVar22;
                        auVar143._8_4_ = uVar22;
                        auVar143._12_4_ = uVar22;
                        uVar22 = *(undefined4 *)(lVar5 + 8 + uVar28 * 4);
                        auVar158._4_4_ = uVar22;
                        auVar158._0_4_ = uVar22;
                        auVar158._8_4_ = uVar22;
                        auVar158._12_4_ = uVar22;
                        fVar56 = *(float *)(lVar33 + uVar28 * 4);
                        fVar67 = *(float *)(lVar33 + 4 + uVar28 * 4);
                        fVar68 = *(float *)(lVar33 + 8 + uVar28 * 4);
                        auVar167._0_4_ = fVar56 * fVar89;
                        auVar167._4_4_ = fVar56 * fVar100;
                        auVar167._8_4_ = fVar56 * fVar102;
                        auVar167._12_4_ = fVar56 * fVar104;
                        auVar179._0_4_ = fVar67 * fVar89;
                        auVar179._4_4_ = fVar67 * fVar100;
                        auVar179._8_4_ = fVar67 * fVar102;
                        auVar179._12_4_ = fVar67 * fVar104;
                        auVar184._0_4_ = fVar68 * fVar89;
                        auVar184._4_4_ = fVar68 * fVar100;
                        auVar184._8_4_ = fVar68 * fVar102;
                        auVar184._12_4_ = fVar68 * fVar104;
                        _local_18f8 = vfmadd231ps_fma(auVar167,auVar55,auVar117);
                        _local_1908 = vfmadd231ps_fma(auVar179,auVar55,auVar143);
                        _local_1868 = vfmadd231ps_fma(auVar184,auVar55,auVar158);
                        uVar28 = (ulong)*(uint *)(lVar26 + 0x30 + uVar27 * 4);
                        fVar56 = *(float *)(lVar33 + uVar28 * 4);
                        fVar67 = *(float *)(lVar33 + 4 + uVar28 * 4);
                        fVar68 = *(float *)(lVar33 + 8 + uVar28 * 4);
                        auVar168._0_4_ = fVar89 * fVar56;
                        auVar168._4_4_ = fVar100 * fVar56;
                        auVar168._8_4_ = fVar102 * fVar56;
                        auVar168._12_4_ = fVar104 * fVar56;
                        auVar118._0_4_ = fVar89 * fVar67;
                        auVar118._4_4_ = fVar100 * fVar67;
                        auVar118._8_4_ = fVar102 * fVar67;
                        auVar118._12_4_ = fVar104 * fVar67;
                        auVar144._0_4_ = fVar89 * fVar68;
                        auVar144._4_4_ = fVar100 * fVar68;
                        auVar144._8_4_ = fVar102 * fVar68;
                        auVar144._12_4_ = fVar104 * fVar68;
                        uVar22 = *(undefined4 *)(lVar5 + uVar28 * 4);
                        auVar40._4_4_ = uVar22;
                        auVar40._0_4_ = uVar22;
                        auVar40._8_4_ = uVar22;
                        auVar40._12_4_ = uVar22;
                        auVar171 = vfmadd231ps_fma(auVar168,auVar55,auVar40);
                        uVar22 = *(undefined4 *)(lVar5 + 4 + uVar28 * 4);
                        auVar41._4_4_ = uVar22;
                        auVar41._0_4_ = uVar22;
                        auVar41._8_4_ = uVar22;
                        auVar41._12_4_ = uVar22;
                        auVar121 = vfmadd231ps_fma(auVar118,auVar55,auVar41);
                        uVar22 = *(undefined4 *)(lVar5 + 8 + uVar28 * 4);
                        auVar42._4_4_ = uVar22;
                        auVar42._0_4_ = uVar22;
                        auVar42._8_4_ = uVar22;
                        auVar42._12_4_ = uVar22;
                        auVar146 = vfmadd231ps_fma(auVar144,auVar55,auVar42);
                      }
                      else {
                        if (uVar32 != 0) {
                          lVar5 = *(long *)&pGVar4[2].numPrimitives;
                          uVar29 = (ulong)*(uint *)(lVar26 + uVar27 * 4);
                          uVar30 = uVar32;
                          uVar28 = uVar12;
                          do {
                            lVar33 = (long)itime.field_0.i[uVar28] * 0x38;
                            auVar55 = *(undefined1 (*) [16])(*(long *)(lVar5 + lVar33) + uVar29 * 4)
                            ;
                            auVar90 = *(undefined1 (*) [16])
                                       (*(long *)(lVar5 + 0x38 + lVar33) + uVar29 * 4);
                            *(int *)((long)&p0.field_0 + uVar28 * 4) = auVar55._0_4_;
                            uVar22 = vextractps_avx(auVar55,1);
                            *(undefined4 *)((long)&p0.field_0 + uVar28 * 4 + 0x10) = uVar22;
                            uVar22 = vextractps_avx(auVar55,2);
                            *(undefined4 *)((long)&p0.field_0 + uVar28 * 4 + 0x20) = uVar22;
                            *(int *)((long)&p1.field_0 + uVar28 * 4) = auVar90._0_4_;
                            uVar22 = vextractps_avx(auVar90,1);
                            *(undefined4 *)((long)&p1.field_0 + uVar28 * 4 + 0x10) = uVar22;
                            uVar22 = vextractps_avx(auVar90,2);
                            *(undefined4 *)((long)&p1.field_0 + uVar28 * 4 + 0x20) = uVar22;
                            uVar30 = uVar30 ^ 1L << (uVar28 & 0x3f);
                            uVar28 = 0;
                            for (uVar13 = uVar30; (uVar13 & 1) == 0;
                                uVar13 = uVar13 >> 1 | 0x8000000000000000) {
                              uVar28 = uVar28 + 1;
                            }
                          } while (uVar30 != 0);
                          auVar74._8_8_ = p0.field_0._8_8_;
                          auVar74._0_8_ = p0.field_0._0_8_;
                          auVar9._8_8_ = p1.field_0._8_8_;
                          auVar9._0_8_ = p1.field_0._0_8_;
                        }
                        auVar60._8_4_ = 0x3f800000;
                        auVar60._0_8_ = 0x3f8000003f800000;
                        auVar60._12_4_ = 0x3f800000;
                        auVar55 = vsubps_avx(auVar60,auVar70);
                        fVar56 = auVar55._0_4_;
                        fVar186 = fVar56 * (float)p0.field_0._16_4_;
                        fVar67 = auVar55._4_4_;
                        fVar189 = fVar67 * (float)p0.field_0._20_4_;
                        fVar68 = auVar55._8_4_;
                        fVar191 = fVar68 * (float)p0.field_0._24_4_;
                        fVar69 = auVar55._12_4_;
                        fVar193 = fVar69 * (float)p0.field_0._28_4_;
                        fVar194 = fVar56 * (float)p0.field_0._32_4_;
                        fVar197 = fVar67 * (float)p0.field_0._36_4_;
                        fVar198 = fVar68 * (float)p0.field_0._40_4_;
                        fVar199 = fVar69 * (float)p0.field_0._44_4_;
                        fVar204 = fVar89 * (float)p1.field_0._16_4_;
                        fVar207 = fVar100 * (float)p1.field_0._20_4_;
                        fVar208 = fVar102 * (float)p1.field_0._24_4_;
                        fVar209 = fVar104 * (float)p1.field_0._28_4_;
                        fVar88 = fVar89 * (float)p1.field_0._32_4_;
                        fVar99 = fVar100 * (float)p1.field_0._36_4_;
                        fVar101 = fVar102 * (float)p1.field_0._40_4_;
                        fVar103 = fVar104 * (float)p1.field_0._44_4_;
                        if (uVar32 != 0) {
                          lVar5 = *(long *)&pGVar4[2].numPrimitives;
                          uVar29 = (ulong)*(uint *)(lVar26 + 0x10 + uVar27 * 4);
                          uVar30 = uVar32;
                          uVar28 = uVar12;
                          do {
                            lVar33 = (long)itime.field_0.i[uVar28] * 0x38;
                            auVar55 = *(undefined1 (*) [16])(*(long *)(lVar5 + lVar33) + uVar29 * 4)
                            ;
                            auVar70 = *(undefined1 (*) [16])
                                       (*(long *)(lVar5 + 0x38 + lVar33) + uVar29 * 4);
                            *(int *)((long)&p0.field_0 + uVar28 * 4) = auVar55._0_4_;
                            uVar22 = vextractps_avx(auVar55,1);
                            *(undefined4 *)((long)&p0.field_0 + uVar28 * 4 + 0x10) = uVar22;
                            uVar22 = vextractps_avx(auVar55,2);
                            *(undefined4 *)((long)&p0.field_0 + uVar28 * 4 + 0x20) = uVar22;
                            *(int *)((long)&p1.field_0 + uVar28 * 4) = auVar70._0_4_;
                            uVar22 = vextractps_avx(auVar70,1);
                            *(undefined4 *)((long)&p1.field_0 + uVar28 * 4 + 0x10) = uVar22;
                            uVar22 = vextractps_avx(auVar70,2);
                            *(undefined4 *)((long)&p1.field_0 + uVar28 * 4 + 0x20) = uVar22;
                            uVar30 = uVar30 ^ 1L << (uVar28 & 0x3f);
                            uVar28 = 0;
                            for (uVar13 = uVar30; (uVar13 & 1) == 0;
                                uVar13 = uVar13 >> 1 | 0x8000000000000000) {
                              uVar28 = uVar28 + 1;
                            }
                          } while (uVar30 != 0);
                          _fStack_18f0 = p0.field_0._8_8_;
                          local_18f8 = (undefined1  [8])p0.field_0._0_8_;
                          auVar210._8_8_ = p1.field_0._8_8_;
                          auVar210._0_8_ = p1.field_0._0_8_;
                        }
                        fVar105 = fVar56 * (float)p0.field_0._16_4_;
                        fVar123 = fVar67 * (float)p0.field_0._20_4_;
                        fVar128 = fVar68 * (float)p0.field_0._24_4_;
                        fVar133 = fVar69 * (float)p0.field_0._28_4_;
                        fVar106 = fVar56 * (float)p0.field_0._32_4_;
                        fVar124 = fVar67 * (float)p0.field_0._36_4_;
                        fVar129 = fVar68 * (float)p0.field_0._40_4_;
                        fVar134 = fVar69 * (float)p0.field_0._44_4_;
                        fVar107 = fVar89 * (float)p1.field_0._16_4_;
                        fVar125 = fVar100 * (float)p1.field_0._20_4_;
                        fVar130 = fVar102 * (float)p1.field_0._24_4_;
                        fVar135 = fVar104 * (float)p1.field_0._28_4_;
                        fVar108 = fVar89 * (float)p1.field_0._32_4_;
                        fVar126 = fVar100 * (float)p1.field_0._36_4_;
                        fVar131 = fVar102 * (float)p1.field_0._40_4_;
                        fVar136 = fVar104 * (float)p1.field_0._44_4_;
                        if (uVar32 != 0) {
                          lVar5 = *(long *)&pGVar4[2].numPrimitives;
                          uVar29 = (ulong)*(uint *)(lVar26 + 0x20 + uVar27 * 4);
                          uVar30 = uVar32;
                          uVar28 = uVar12;
                          do {
                            lVar33 = (long)itime.field_0.i[uVar28] * 0x38;
                            auVar55 = *(undefined1 (*) [16])(*(long *)(lVar5 + lVar33) + uVar29 * 4)
                            ;
                            auVar70 = *(undefined1 (*) [16])
                                       (*(long *)(lVar5 + 0x38 + lVar33) + uVar29 * 4);
                            *(int *)((long)&p0.field_0 + uVar28 * 4) = auVar55._0_4_;
                            uVar22 = vextractps_avx(auVar55,1);
                            *(undefined4 *)((long)&p0.field_0 + uVar28 * 4 + 0x10) = uVar22;
                            uVar22 = vextractps_avx(auVar55,2);
                            *(undefined4 *)((long)&p0.field_0 + uVar28 * 4 + 0x20) = uVar22;
                            *(int *)((long)&p1.field_0 + uVar28 * 4) = auVar70._0_4_;
                            uVar22 = vextractps_avx(auVar70,1);
                            *(undefined4 *)((long)&p1.field_0 + uVar28 * 4 + 0x10) = uVar22;
                            uVar22 = vextractps_avx(auVar70,2);
                            *(undefined4 *)((long)&p1.field_0 + uVar28 * 4 + 0x20) = uVar22;
                            uVar30 = uVar30 ^ 1L << (uVar28 & 0x3f);
                            uVar28 = 0;
                            for (uVar13 = uVar30; (uVar13 & 1) == 0;
                                uVar13 = uVar13 >> 1 | 0x8000000000000000) {
                              uVar28 = uVar28 + 1;
                            }
                          } while (uVar30 != 0);
                          auVar200._8_8_ = p0.field_0._8_8_;
                          auVar200._0_8_ = p0.field_0._0_8_;
                          _fStack_1900 = p1.field_0._8_8_;
                          local_1908 = (undefined1  [8])p1.field_0._0_8_;
                        }
                        fVar109 = fVar56 * (float)p0.field_0._16_4_;
                        fVar127 = fVar67 * (float)p0.field_0._20_4_;
                        fVar132 = fVar68 * (float)p0.field_0._24_4_;
                        fVar137 = fVar69 * (float)p0.field_0._28_4_;
                        fVar138 = fVar56 * (float)p0.field_0._32_4_;
                        fVar149 = fVar67 * (float)p0.field_0._36_4_;
                        fVar150 = fVar68 * (float)p0.field_0._40_4_;
                        fVar151 = fVar69 * (float)p0.field_0._44_4_;
                        fVar152 = fVar89 * (float)p1.field_0._16_4_;
                        fVar162 = fVar100 * (float)p1.field_0._20_4_;
                        fVar163 = fVar102 * (float)p1.field_0._24_4_;
                        fVar164 = fVar104 * (float)p1.field_0._28_4_;
                        fVar165 = fVar89 * (float)p1.field_0._32_4_;
                        fVar174 = fVar100 * (float)p1.field_0._36_4_;
                        fVar175 = fVar102 * (float)p1.field_0._40_4_;
                        fVar176 = fVar104 * (float)p1.field_0._44_4_;
                        if (uVar32 != 0) {
                          lVar5 = *(long *)&pGVar4[2].numPrimitives;
                          uVar29 = (ulong)*(uint *)(lVar26 + 0x30 + uVar27 * 4);
                          uVar30 = uVar32;
                          uVar28 = uVar12;
                          do {
                            lVar33 = (long)itime.field_0.i[uVar28] * 0x38;
                            auVar55 = *(undefined1 (*) [16])(*(long *)(lVar5 + lVar33) + uVar29 * 4)
                            ;
                            auVar70 = *(undefined1 (*) [16])
                                       (*(long *)(lVar5 + 0x38 + lVar33) + uVar29 * 4);
                            *(int *)((long)&p0.field_0 + uVar28 * 4) = auVar55._0_4_;
                            uVar22 = vextractps_avx(auVar55,1);
                            *(undefined4 *)((long)&p0.field_0 + uVar28 * 4 + 0x10) = uVar22;
                            uVar22 = vextractps_avx(auVar55,2);
                            *(undefined4 *)((long)&p0.field_0 + uVar28 * 4 + 0x20) = uVar22;
                            *(int *)((long)&p1.field_0 + uVar28 * 4) = auVar70._0_4_;
                            uVar22 = vextractps_avx(auVar70,1);
                            *(undefined4 *)((long)&p1.field_0 + uVar28 * 4 + 0x10) = uVar22;
                            uVar22 = vextractps_avx(auVar70,2);
                            *(undefined4 *)((long)&p1.field_0 + uVar28 * 4 + 0x20) = uVar22;
                            uVar30 = uVar30 ^ 1L << (uVar28 & 0x3f);
                            uVar28 = 0;
                            for (uVar13 = uVar30; (uVar13 & 1) == 0;
                                uVar13 = uVar13 >> 1 | 0x8000000000000000) {
                              uVar28 = uVar28 + 1;
                            }
                          } while (uVar30 != 0);
                          auVar183._8_8_ = p0.field_0._8_8_;
                          auVar183._0_8_ = p0.field_0._0_8_;
                          auVar178._8_8_ = p1.field_0._8_8_;
                          auVar178._0_8_ = p1.field_0._0_8_;
                        }
                        auVar77._0_4_ = fVar56 * auVar74._0_4_ + fVar89 * auVar9._0_4_;
                        auVar77._4_4_ = fVar67 * auVar74._4_4_ + fVar100 * auVar9._4_4_;
                        auVar77._8_4_ = fVar68 * auVar74._8_4_ + fVar102 * auVar9._8_4_;
                        auVar77._12_4_ = fVar69 * auVar74._12_4_ + fVar104 * auVar9._12_4_;
                        auVar85._0_4_ = fVar186 + fVar204;
                        auVar85._4_4_ = fVar189 + fVar207;
                        auVar85._8_4_ = fVar191 + fVar208;
                        auVar85._12_4_ = fVar193 + fVar209;
                        auVar98._0_4_ = fVar194 + fVar88;
                        auVar98._4_4_ = fVar197 + fVar99;
                        auVar98._8_4_ = fVar198 + fVar101;
                        auVar98._12_4_ = fVar199 + fVar103;
                        auVar196._0_4_ = fVar56 * (float)local_18f8._0_4_ + auVar210._0_4_ * fVar89;
                        auVar196._4_4_ = fVar67 * (float)local_18f8._4_4_ + auVar210._4_4_ * fVar100
                        ;
                        auVar196._8_4_ = fVar68 * fStack_18f0 + auVar210._8_4_ * fVar102;
                        auVar196._12_4_ = fVar69 * fStack_18ec + auVar210._12_4_ * fVar104;
                        auVar214._0_4_ = fVar107 + fVar105;
                        auVar214._4_4_ = fVar125 + fVar123;
                        auVar214._8_4_ = fVar130 + fVar128;
                        auVar214._12_4_ = fVar135 + fVar133;
                        auVar206._0_4_ = fVar108 + fVar106;
                        auVar206._4_4_ = fVar126 + fVar124;
                        auVar206._8_4_ = fVar131 + fVar129;
                        auVar206._12_4_ = fVar136 + fVar134;
                        local_18f8._4_4_ =
                             auVar200._4_4_ * fVar67 + fVar100 * (float)local_1908._4_4_;
                        local_18f8._0_4_ =
                             auVar200._0_4_ * fVar56 + fVar89 * (float)local_1908._0_4_;
                        fStack_18f0 = auVar200._8_4_ * fVar68 + fVar102 * fStack_1900;
                        fStack_18ec = auVar200._12_4_ * fVar69 + fVar104 * fStack_18fc;
                        local_1908._4_4_ = fVar127 + fVar162;
                        local_1908._0_4_ = fVar109 + fVar152;
                        fStack_1900 = fVar132 + fVar163;
                        fStack_18fc = fVar137 + fVar164;
                        local_1868._4_4_ = fVar174 + fVar149;
                        local_1868._0_4_ = fVar165 + fVar138;
                        fStack_1860 = fVar175 + fVar150;
                        fStack_185c = fVar176 + fVar151;
                        auVar171._0_4_ = auVar183._0_4_ * fVar56 + auVar178._0_4_ * fVar89;
                        auVar171._4_4_ = auVar183._4_4_ * fVar67 + auVar178._4_4_ * fVar100;
                        auVar171._8_4_ = auVar183._8_4_ * fVar68 + auVar178._8_4_ * fVar102;
                        auVar171._12_4_ = auVar183._12_4_ * fVar69 + auVar178._12_4_ * fVar104;
                        auVar121._0_4_ =
                             fVar56 * (float)p0.field_0._16_4_ + fVar89 * (float)p1.field_0._16_4_;
                        auVar121._4_4_ =
                             fVar67 * (float)p0.field_0._20_4_ + fVar100 * (float)p1.field_0._20_4_;
                        auVar121._8_4_ =
                             fVar68 * (float)p0.field_0._24_4_ + fVar102 * (float)p1.field_0._24_4_;
                        auVar121._12_4_ =
                             fVar69 * (float)p0.field_0._28_4_ + fVar104 * (float)p1.field_0._28_4_;
                        auVar146._0_4_ =
                             fVar56 * (float)p0.field_0._32_4_ + fVar89 * (float)p1.field_0._32_4_;
                        auVar146._4_4_ =
                             fVar67 * (float)p0.field_0._36_4_ + fVar100 * (float)p1.field_0._36_4_;
                        auVar146._8_4_ =
                             fVar68 * (float)p0.field_0._40_4_ + fVar102 * (float)p1.field_0._40_4_;
                        auVar146._12_4_ =
                             fVar69 * (float)p0.field_0._44_4_ + fVar104 * (float)p1.field_0._44_4_;
                      }
                      auVar91 = vsubps_avx(auVar77,auVar196);
                      auVar110 = vsubps_avx(auVar85,auVar214);
                      auVar111 = vsubps_avx(auVar98,auVar206);
                      auVar181 = vsubps_avx(auVar171,auVar77);
                      auVar182 = vsubps_avx(auVar121,auVar85);
                      auVar82 = vsubps_avx(auVar146,auVar98);
                      auVar119._0_4_ = auVar82._0_4_ * auVar110._0_4_;
                      auVar119._4_4_ = auVar82._4_4_ * auVar110._4_4_;
                      auVar119._8_4_ = auVar82._8_4_ * auVar110._8_4_;
                      auVar119._12_4_ = auVar82._12_4_ * auVar110._12_4_;
                      auVar112 = vfmsub231ps_fma(auVar119,auVar182,auVar111);
                      auVar145._0_4_ = auVar111._0_4_ * auVar181._0_4_;
                      auVar145._4_4_ = auVar111._4_4_ * auVar181._4_4_;
                      auVar145._8_4_ = auVar111._8_4_ * auVar181._8_4_;
                      auVar145._12_4_ = auVar111._12_4_ * auVar181._12_4_;
                      auVar113 = vfmsub231ps_fma(auVar145,auVar82,auVar91);
                      auVar159._0_4_ = auVar182._0_4_ * auVar91._0_4_;
                      auVar159._4_4_ = auVar182._4_4_ * auVar91._4_4_;
                      auVar159._8_4_ = auVar182._8_4_ * auVar91._8_4_;
                      auVar159._12_4_ = auVar182._12_4_ * auVar91._12_4_;
                      auVar92 = vsubps_avx(auVar77,*(undefined1 (*) [16])ray);
                      auVar10 = vsubps_avx(auVar85,*(undefined1 (*) [16])(ray + 0x10));
                      auVar180 = ZEXT1664(auVar10);
                      auVar139 = vfmsub231ps_fma(auVar159,auVar181,auVar110);
                      auVar11 = vsubps_avx(auVar98,*(undefined1 (*) [16])(ray + 0x20));
                      auVar185 = ZEXT1664(auVar11);
                      auVar55 = *(undefined1 (*) [16])(ray + 0x40);
                      auVar70 = *(undefined1 (*) [16])(ray + 0x50);
                      auVar90 = *(undefined1 (*) [16])(ray + 0x60);
                      auVar84._0_4_ = auVar10._0_4_ * auVar55._0_4_;
                      auVar84._4_4_ = auVar10._4_4_ * auVar55._4_4_;
                      auVar84._8_4_ = auVar10._8_4_ * auVar55._8_4_;
                      auVar84._12_4_ = auVar10._12_4_ * auVar55._12_4_;
                      auVar140 = vfmsub231ps_fma(auVar84,auVar92,auVar70);
                      auVar169._0_4_ = auVar139._0_4_ * auVar90._0_4_;
                      auVar169._4_4_ = auVar139._4_4_ * auVar90._4_4_;
                      auVar169._8_4_ = auVar139._8_4_ * auVar90._8_4_;
                      auVar169._12_4_ = auVar139._12_4_ * auVar90._12_4_;
                      auVar93 = vfmadd231ps_fma(auVar169,auVar113,auVar70);
                      auVar212._0_4_ = auVar11._0_4_ * auVar70._0_4_;
                      auVar212._4_4_ = auVar11._4_4_ * auVar70._4_4_;
                      auVar212._8_4_ = auVar11._8_4_ * auVar70._8_4_;
                      auVar212._12_4_ = auVar11._12_4_ * auVar70._12_4_;
                      auVar153 = vfmsub231ps_fma(auVar212,auVar10,auVar90);
                      auVar96._0_4_ = auVar90._0_4_ * auVar92._0_4_;
                      auVar96._4_4_ = auVar90._4_4_ * auVar92._4_4_;
                      auVar96._8_4_ = auVar90._8_4_ * auVar92._8_4_;
                      auVar96._12_4_ = auVar90._12_4_ * auVar92._12_4_;
                      auVar154 = vfmsub231ps_fma(auVar96,auVar11,auVar55);
                      auVar90 = vfmadd231ps_fma(auVar93,auVar112,auVar55);
                      auVar43._0_4_ = auVar82._0_4_ * auVar140._0_4_;
                      auVar43._4_4_ = auVar82._4_4_ * auVar140._4_4_;
                      auVar43._8_4_ = auVar82._8_4_ * auVar140._8_4_;
                      auVar43._12_4_ = auVar82._12_4_ * auVar140._12_4_;
                      auVar55 = vfmadd231ps_fma(auVar43,auVar154,auVar182);
                      auVar58._8_4_ = 0x80000000;
                      auVar58._0_8_ = 0x8000000080000000;
                      auVar58._12_4_ = 0x80000000;
                      auVar70 = vfmadd231ps_fma(auVar55,auVar153,auVar181);
                      auVar55 = vandps_avx(auVar90,auVar58);
                      uVar21 = auVar55._0_4_;
                      auVar202._0_4_ = (float)(uVar21 ^ auVar70._0_4_);
                      uVar188 = auVar55._4_4_;
                      auVar202._4_4_ = (float)(uVar188 ^ auVar70._4_4_);
                      uVar190 = auVar55._8_4_;
                      auVar202._8_4_ = (float)(uVar190 ^ auVar70._8_4_);
                      uVar192 = auVar55._12_4_;
                      auVar202._12_4_ = (float)(uVar192 ^ auVar70._12_4_);
                      in_ZMM13 = ZEXT1664(auVar202);
                      auVar55 = vcmpps_avx(auVar202,_DAT_01f7aa10,5);
                      auVar70 = auVar71 & auVar55;
                      if ((((auVar70 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                           (auVar70 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar70 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          -1 < auVar70[0xf]) {
                        auVar215 = ZEXT1664(CONCAT412(0x7f800000,
                                                      CONCAT48(0x7f800000,0x7f8000007f800000)));
                        auVar55 = vpcmpeqd_avx(auVar58,auVar58);
                        auVar66 = ZEXT1664(auVar55);
                      }
                      else {
                        auVar55 = vandps_avx(auVar55,auVar71);
                        auVar45._0_4_ = auVar111._0_4_ * auVar140._0_4_;
                        auVar45._4_4_ = auVar111._4_4_ * auVar140._4_4_;
                        auVar45._8_4_ = auVar111._8_4_ * auVar140._8_4_;
                        auVar45._12_4_ = auVar111._12_4_ * auVar140._12_4_;
                        auVar111 = vfmadd213ps_fma(auVar110,auVar154,auVar45);
                        auVar70 = vfmadd213ps_fma(auVar91,auVar153,auVar111);
                        auVar160._0_4_ = (float)(uVar21 ^ auVar70._0_4_);
                        auVar160._4_4_ = (float)(uVar188 ^ auVar70._4_4_);
                        auVar160._8_4_ = (float)(uVar190 ^ auVar70._8_4_);
                        auVar160._12_4_ = (float)(uVar192 ^ auVar70._12_4_);
                        auVar70 = vcmpps_avx(auVar160,_DAT_01f7aa10,5);
                        auVar110 = auVar55 & auVar70;
                        auVar91 = vpcmpeqd_avx(auVar111,auVar111);
                        auVar66 = ZEXT1664(auVar91);
                        if ((((auVar110 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar110 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar110 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            auVar110[0xf] < '\0') {
                          auVar91 = vandps_avx(auVar90,auVar195);
                          auVar55 = vandps_avx(auVar55,auVar70);
                          auVar70 = vsubps_avx(auVar91,auVar202);
                          auVar70 = vcmpps_avx(auVar70,auVar160,5);
                          auVar110 = auVar55 & auVar70;
                          if ((((auVar110 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               || (auVar110 >> 0x3f & (undefined1  [16])0x1) !=
                                  (undefined1  [16])0x0) ||
                              (auVar110 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || auVar110[0xf] < '\0') {
                            auVar55 = vandps_avx(auVar70,auVar55);
                            auVar47._0_4_ = auVar11._0_4_ * auVar139._0_4_;
                            auVar47._4_4_ = auVar11._4_4_ * auVar139._4_4_;
                            auVar47._8_4_ = auVar11._8_4_ * auVar139._8_4_;
                            auVar47._12_4_ = auVar11._12_4_ * auVar139._12_4_;
                            auVar181 = vfmadd132ps_fma(auVar10,auVar47,auVar113);
                            auVar180 = ZEXT1664(auVar181);
                            auVar70 = vfmadd132ps_fma(auVar92,auVar181,auVar112);
                            auVar147._0_4_ = (float)(uVar21 ^ auVar70._0_4_);
                            auVar147._4_4_ = (float)(uVar188 ^ auVar70._4_4_);
                            auVar147._8_4_ = (float)(uVar190 ^ auVar70._8_4_);
                            auVar147._12_4_ = (float)(uVar192 ^ auVar70._12_4_);
                            auVar48._0_4_ = auVar91._0_4_ * *(float *)(ray + 0x30);
                            auVar48._4_4_ = auVar91._4_4_ * *(float *)(ray + 0x34);
                            auVar48._8_4_ = auVar91._8_4_ * *(float *)(ray + 0x38);
                            auVar48._12_4_ = auVar91._12_4_ * *(float *)(ray + 0x3c);
                            auVar70 = vcmpps_avx(auVar48,auVar147,1);
                            auVar182 = *(undefined1 (*) [16])(ray + 0x80);
                            auVar61._0_4_ = auVar91._0_4_ * *(float *)(ray + 0x80);
                            auVar61._4_4_ = auVar91._4_4_ * *(float *)(ray + 0x84);
                            auVar61._8_4_ = auVar91._8_4_ * *(float *)(ray + 0x88);
                            auVar61._12_4_ = auVar91._12_4_ * *(float *)(ray + 0x8c);
                            auVar110 = vcmpps_avx(auVar147,auVar61,2);
                            auVar70 = vandps_avx(auVar110,auVar70);
                            auVar111 = auVar55 & auVar70;
                            if ((((auVar111 >> 0x1f & (undefined1  [16])0x1) ==
                                  (undefined1  [16])0x0 &&
                                 (auVar111 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                 ) && (auVar111 >> 0x5f & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) && -1 < auVar111[0xf]) {
LAB_004e2c26:
                              auVar55 = vpcmpeqd_avx(auVar110,auVar110);
                            }
                            else {
                              auVar55 = vandps_avx(auVar70,auVar55);
                              auVar70 = vcmpps_avx(auVar90,_DAT_01f7aa10,4);
                              auVar90 = auVar55 & auVar70;
                              if ((((auVar90 >> 0x1f & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0 &&
                                   (auVar90 >> 0x3f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar90 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && -1 < auVar90[0xf]) goto LAB_004e2c26;
                              auVar55 = vandps_avx(auVar70,auVar55);
                              uVar21 = pGVar4->mask;
                              auVar49._4_4_ = uVar21;
                              auVar49._0_4_ = uVar21;
                              auVar49._8_4_ = uVar21;
                              auVar49._12_4_ = uVar21;
                              auVar70 = vpand_avx(auVar49,*(undefined1 (*) [16])(ray + 0x90));
                              auVar70 = vpcmpeqd_avx(auVar70,_DAT_01f7aa10);
                              auVar90 = auVar55 & ~auVar70;
                              if ((((auVar90 >> 0x1f & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0 &&
                                   (auVar90 >> 0x3f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar90 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && -1 < auVar90[0xf]) goto LAB_004e2c26;
                              aVar87 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                       vandnps_avx(auVar70,auVar55);
                              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                 (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                auVar55 = vrcpps_avx(auVar91);
                                auVar172._8_4_ = 0x3f800000;
                                auVar172._0_8_ = 0x3f8000003f800000;
                                auVar172._12_4_ = 0x3f800000;
                                auVar70 = vfnmadd213ps_fma(auVar91,auVar55,auVar172);
                                auVar55 = vfmadd132ps_fma(auVar70,auVar55,auVar55);
                                fVar89 = auVar55._0_4_;
                                auVar53._0_4_ = auVar202._0_4_ * fVar89;
                                fVar100 = auVar55._4_4_;
                                auVar53._4_4_ = auVar202._4_4_ * fVar100;
                                fVar102 = auVar55._8_4_;
                                auVar53._8_4_ = auVar202._8_4_ * fVar102;
                                fVar104 = auVar55._12_4_;
                                auVar53._12_4_ = auVar202._12_4_ * fVar104;
                                auVar55 = vminps_avx(auVar53,auVar172);
                                auVar62._0_4_ = fVar89 * auVar160._0_4_;
                                auVar62._4_4_ = fVar100 * auVar160._4_4_;
                                auVar62._8_4_ = fVar102 * auVar160._8_4_;
                                auVar62._12_4_ = fVar104 * auVar160._12_4_;
                                auVar70 = vminps_avx(auVar62,auVar172);
                                auVar90 = vsubps_avx(auVar172,auVar55);
                                auVar91 = vsubps_avx(auVar172,auVar70);
                                auVar15._8_8_ = uVar17;
                                auVar15._0_8_ = uVar16;
                                auVar55 = vblendvps_avx(auVar55,auVar90,auVar15);
                                vblendvps_avx(auVar70,auVar91,auVar15);
                                local_1898 = auVar112._0_8_;
                                uStack_1890 = auVar112._8_8_;
                                p0.field_0._0_8_ = local_1898;
                                p0.field_0._8_8_ = uStack_1890;
                                local_18a8 = auVar113._0_8_;
                                uStack_18a0 = auVar113._8_8_;
                                p0.field_0._16_8_ = local_18a8;
                                p0.field_0._24_8_ = uStack_18a0;
                                p0.field_0._32_16_ = auVar139;
                                vpcmpeqd_avx2(ZEXT1632(auVar55),ZEXT1632(auVar55));
                                auVar63._0_4_ = fVar89 * auVar147._0_4_;
                                auVar63._4_4_ = fVar100 * auVar147._4_4_;
                                auVar63._8_4_ = fVar102 * auVar147._8_4_;
                                auVar63._12_4_ = fVar104 * auVar147._12_4_;
                                auVar55 = vblendvps_avx(auVar182,auVar63,(undefined1  [16])aVar87);
                                *(undefined1 (*) [16])(ray + 0x80) = auVar55;
                                itime.field_0 = aVar87;
                                p1.field_0._0_8_ = &itime;
                                p1.field_0._8_8_ = pGVar4->userPtr;
                                p1.field_0._16_8_ = context->user;
                                p1.field_0._24_8_ = ray;
                                p1.field_0._32_8_ = &p0;
                                p1.field_0._40_4_ = 4;
                                if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                  auVar180 = ZEXT1664(auVar181);
                                  auVar185 = ZEXT1664(auVar11);
                                  in_ZMM13 = ZEXT1664(auVar202);
                                  (*pGVar4->occlusionFilterN)((RTCFilterFunctionNArguments *)&p1);
                                }
                                if (itime.field_0 ==
                                    (anon_union_16_2_9473010e_for_vint_impl<4>_1)0x0) {
                                  auVar55 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                                  auVar55 = auVar55 ^ _DAT_01f7ae20;
                                }
                                else {
                                  p_Var6 = context->args->filter;
                                  if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                                     (((context->args->flags &
                                       RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                      (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                                    auVar180 = ZEXT1664(auVar180._0_16_);
                                    auVar185 = ZEXT1664(auVar185._0_16_);
                                    in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                                    (*p_Var6)((RTCFilterFunctionNArguments *)&p1);
                                  }
                                  auVar70 = vpcmpeqd_avx((undefined1  [16])itime.field_0,
                                                         _DAT_01f7aa10);
                                  auVar55 = auVar70 ^ _DAT_01f7ae20;
                                  auVar78._8_4_ = 0xff800000;
                                  auVar78._0_8_ = 0xff800000ff800000;
                                  auVar78._12_4_ = 0xff800000;
                                  auVar70 = vblendvps_avx(auVar78,*(undefined1 (*) [16])
                                                                   (p1.field_0._24_8_ + 0x80),
                                                          auVar70);
                                  *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80) = auVar70;
                                }
                                auVar55 = vpslld_avx(auVar55,0x1f);
                                aVar87 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                         vpsrad_avx(auVar55,0x1f);
                                auVar55 = vblendvps_avx(auVar182,*(undefined1 (*) [16])pRVar1,
                                                        auVar55);
                                *(undefined1 (*) [16])pRVar1 = auVar55;
                                auVar110 = auVar182;
                              }
                              auVar71 = vpandn_avx((undefined1  [16])aVar87,auVar71);
                              auVar55 = vpcmpeqd_avx(auVar110,auVar110);
                            }
                            auVar215 = ZEXT1664(CONCAT412(0x7f800000,
                                                          CONCAT48(0x7f800000,0x7f8000007f800000)));
                            auVar66 = ZEXT1664(auVar55);
                            goto LAB_004e23b9;
                          }
                        }
                        auVar215 = ZEXT1664(CONCAT412(0x7f800000,
                                                      CONCAT48(0x7f800000,0x7f8000007f800000)));
                      }
LAB_004e23b9:
                      if ((((auVar71 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                           (auVar71 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar71 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          -1 < auVar71[0xf]) break;
                      auVar91 = vsubps_avx(_local_18f8,auVar171);
                      auVar110 = vsubps_avx(_local_1908,auVar121);
                      auVar111 = vsubps_avx(_local_1868,auVar146);
                      auVar185 = ZEXT1664(auVar111);
                      auVar181 = vsubps_avx(auVar196,_local_18f8);
                      auVar182 = vsubps_avx(auVar214,_local_1908);
                      auVar82 = vsubps_avx(auVar206,_local_1868);
                      auVar59._0_4_ = auVar82._0_4_ * auVar110._0_4_;
                      auVar59._4_4_ = auVar82._4_4_ * auVar110._4_4_;
                      auVar59._8_4_ = auVar82._8_4_ * auVar110._8_4_;
                      auVar59._12_4_ = auVar82._12_4_ * auVar110._12_4_;
                      auVar112 = vfmsub231ps_fma(auVar59,auVar182,auVar111);
                      auVar76._0_4_ = auVar111._0_4_ * auVar181._0_4_;
                      auVar76._4_4_ = auVar111._4_4_ * auVar181._4_4_;
                      auVar76._8_4_ = auVar111._8_4_ * auVar181._8_4_;
                      auVar76._12_4_ = auVar111._12_4_ * auVar181._12_4_;
                      auVar113 = vfmsub231ps_fma(auVar76,auVar82,auVar91);
                      auVar97._0_4_ = auVar182._0_4_ * auVar91._0_4_;
                      auVar97._4_4_ = auVar182._4_4_ * auVar91._4_4_;
                      auVar97._8_4_ = auVar182._8_4_ * auVar91._8_4_;
                      auVar97._12_4_ = auVar182._12_4_ * auVar91._12_4_;
                      auVar92 = vsubps_avx(_local_18f8,*(undefined1 (*) [16])ray);
                      auVar10 = vsubps_avx(_local_1908,*(undefined1 (*) [16])(ray + 0x10));
                      auVar11 = vsubps_avx(_local_1868,*(undefined1 (*) [16])(ray + 0x20));
                      auVar180 = ZEXT1664(auVar11);
                      auVar139 = vfmsub231ps_fma(auVar97,auVar181,auVar110);
                      auVar55 = *(undefined1 (*) [16])(ray + 0x40);
                      auVar70 = *(undefined1 (*) [16])(ray + 0x50);
                      auVar203._0_4_ = auVar55._0_4_ * auVar10._0_4_;
                      auVar203._4_4_ = auVar55._4_4_ * auVar10._4_4_;
                      auVar203._8_4_ = auVar55._8_4_ * auVar10._8_4_;
                      auVar203._12_4_ = auVar55._12_4_ * auVar10._12_4_;
                      auVar140 = vfmsub231ps_fma(auVar203,auVar92,auVar70);
                      in_ZMM13 = ZEXT1664(auVar140);
                      auVar90 = *(undefined1 (*) [16])(ray + 0x60);
                      auVar170._0_4_ = auVar90._0_4_ * auVar139._0_4_;
                      auVar170._4_4_ = auVar90._4_4_ * auVar139._4_4_;
                      auVar170._8_4_ = auVar90._8_4_ * auVar139._8_4_;
                      auVar170._12_4_ = auVar90._12_4_ * auVar139._12_4_;
                      auVar93 = vfmadd231ps_fma(auVar170,auVar113,auVar70);
                      auVar205._0_4_ = auVar70._0_4_ * auVar11._0_4_;
                      auVar205._4_4_ = auVar70._4_4_ * auVar11._4_4_;
                      auVar205._8_4_ = auVar70._8_4_ * auVar11._8_4_;
                      auVar205._12_4_ = auVar70._12_4_ * auVar11._12_4_;
                      auVar153 = vfmsub231ps_fma(auVar205,auVar10,auVar90);
                      auVar213._0_4_ = auVar90._0_4_ * auVar92._0_4_;
                      auVar213._4_4_ = auVar90._4_4_ * auVar92._4_4_;
                      auVar213._8_4_ = auVar90._8_4_ * auVar92._8_4_;
                      auVar213._12_4_ = auVar90._12_4_ * auVar92._12_4_;
                      auVar154 = vfmsub231ps_fma(auVar213,auVar11,auVar55);
                      auVar90 = vfmadd231ps_fma(auVar93,auVar112,auVar55);
                      auVar44._0_4_ = auVar82._0_4_ * auVar140._0_4_;
                      auVar44._4_4_ = auVar82._4_4_ * auVar140._4_4_;
                      auVar44._8_4_ = auVar82._8_4_ * auVar140._8_4_;
                      auVar44._12_4_ = auVar82._12_4_ * auVar140._12_4_;
                      auVar70 = vfmadd231ps_fma(auVar44,auVar154,auVar182);
                      auVar55 = vandps_avx(auVar90,auVar58);
                      auVar70 = vfmadd231ps_fma(auVar70,auVar153,auVar181);
                      uVar21 = auVar55._0_4_;
                      auVar120._0_4_ = (float)(uVar21 ^ auVar70._0_4_);
                      uVar188 = auVar55._4_4_;
                      auVar120._4_4_ = (float)(uVar188 ^ auVar70._4_4_);
                      uVar190 = auVar55._8_4_;
                      auVar120._8_4_ = (float)(uVar190 ^ auVar70._8_4_);
                      uVar192 = auVar55._12_4_;
                      auVar120._12_4_ = (float)(uVar192 ^ auVar70._12_4_);
                      auVar81 = ZEXT1664(auVar71);
                      auVar55 = vcmpps_avx(auVar120,_DAT_01f7aa10,5);
                      auVar70 = auVar71 & auVar55;
                      if ((((auVar70 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                           (auVar70 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar70 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          -1 < auVar70[0xf]) {
                        auVar215 = ZEXT1664(CONCAT412(0x7f800000,
                                                      CONCAT48(0x7f800000,0x7f8000007f800000)));
                      }
                      else {
                        auVar55 = vandps_avx(auVar55,auVar71);
                        auVar46._0_4_ = auVar111._0_4_ * auVar140._0_4_;
                        auVar46._4_4_ = auVar111._4_4_ * auVar140._4_4_;
                        auVar46._8_4_ = auVar111._8_4_ * auVar140._8_4_;
                        auVar46._12_4_ = auVar111._12_4_ * auVar140._12_4_;
                        auVar70 = vfmadd213ps_fma(auVar110,auVar154,auVar46);
                        auVar70 = vfmadd213ps_fma(auVar91,auVar153,auVar70);
                        auVar161._0_4_ = (float)(uVar21 ^ auVar70._0_4_);
                        auVar161._4_4_ = (float)(uVar188 ^ auVar70._4_4_);
                        auVar161._8_4_ = (float)(uVar190 ^ auVar70._8_4_);
                        auVar161._12_4_ = (float)(uVar192 ^ auVar70._12_4_);
                        auVar70 = vcmpps_avx(auVar161,_DAT_01f7aa10,5);
                        auVar91 = auVar55 & auVar70;
                        if ((((auVar91 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar91 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar91 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            auVar91[0xf] < '\0') {
                          auVar91 = vandps_avx(auVar90,auVar195);
                          auVar70 = vandps_avx(auVar70,auVar55);
                          auVar55 = vsubps_avx(auVar91,auVar120);
                          auVar55 = vcmpps_avx(auVar55,auVar161,5);
                          auVar110 = auVar70 & auVar55;
                          if ((((auVar110 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               || (auVar110 >> 0x3f & (undefined1  [16])0x1) !=
                                  (undefined1  [16])0x0) ||
                              (auVar110 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || auVar110[0xf] < '\0') {
                            auVar55 = vandps_avx(auVar55,auVar70);
                            auVar185 = ZEXT1664(auVar55);
                            auVar50._0_4_ = auVar11._0_4_ * auVar139._0_4_;
                            auVar50._4_4_ = auVar11._4_4_ * auVar139._4_4_;
                            auVar50._8_4_ = auVar11._8_4_ * auVar139._8_4_;
                            auVar50._12_4_ = auVar11._12_4_ * auVar139._12_4_;
                            auVar70 = vfmadd132ps_fma(auVar10,auVar50,auVar113);
                            auVar70 = vfmadd132ps_fma(auVar92,auVar70,auVar112);
                            auVar148._0_4_ = (float)(uVar21 ^ auVar70._0_4_);
                            auVar148._4_4_ = (float)(uVar188 ^ auVar70._4_4_);
                            auVar148._8_4_ = (float)(uVar190 ^ auVar70._8_4_);
                            auVar148._12_4_ = (float)(uVar192 ^ auVar70._12_4_);
                            auVar51._0_4_ = auVar91._0_4_ * *(float *)(ray + 0x30);
                            auVar51._4_4_ = auVar91._4_4_ * *(float *)(ray + 0x34);
                            auVar51._8_4_ = auVar91._8_4_ * *(float *)(ray + 0x38);
                            auVar51._12_4_ = auVar91._12_4_ * *(float *)(ray + 0x3c);
                            auVar70 = vcmpps_avx(auVar51,auVar148,1);
                            auVar111 = *(undefined1 (*) [16])(ray + 0x80);
                            auVar86._0_4_ = auVar91._0_4_ * *(float *)(ray + 0x80);
                            auVar86._4_4_ = auVar91._4_4_ * *(float *)(ray + 0x84);
                            auVar86._8_4_ = auVar91._8_4_ * *(float *)(ray + 0x88);
                            auVar86._12_4_ = auVar91._12_4_ * *(float *)(ray + 0x8c);
                            auVar110 = vcmpps_avx(auVar148,auVar86,2);
                            auVar70 = vandps_avx(auVar110,auVar70);
                            auVar110 = auVar55 & auVar70;
                            if ((((auVar110 >> 0x1f & (undefined1  [16])0x1) !=
                                  (undefined1  [16])0x0 ||
                                 (auVar110 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                 ) || (auVar110 >> 0x5f & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) || auVar110[0xf] < '\0') {
                              auVar70 = vandps_avx(auVar55,auVar70);
                              auVar90 = vcmpps_avx(auVar90,_DAT_01f7aa10,4);
                              auVar110 = auVar70 & auVar90;
                              if ((((auVar110 >> 0x1f & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0 ||
                                   (auVar110 >> 0x3f & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                                  (auVar110 >> 0x5f & (undefined1  [16])0x1) !=
                                  (undefined1  [16])0x0) || auVar110[0xf] < '\0') {
                                auVar70 = vandps_avx(auVar90,auVar70);
                                pGVar4 = (context->scene->geometries).items
                                         [*(uint *)(lVar26 + 0x40 + uVar27 * 4)].ptr;
                                uVar21 = pGVar4->mask;
                                auVar52._4_4_ = uVar21;
                                auVar52._0_4_ = uVar21;
                                auVar52._8_4_ = uVar21;
                                auVar52._12_4_ = uVar21;
                                auVar90 = vpand_avx(auVar52,*(undefined1 (*) [16])(ray + 0x90));
                                auVar90 = vpcmpeqd_avx(auVar90,_DAT_01f7aa10);
                                auVar110 = auVar70 & ~auVar90;
                                if ((((auVar110 >> 0x1f & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0 ||
                                     (auVar110 >> 0x3f & (undefined1  [16])0x1) !=
                                     (undefined1  [16])0x0) ||
                                    (auVar110 >> 0x5f & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) || auVar110[0xf] < '\0') {
                                  aVar87 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                           vandnps_avx(auVar90,auVar70);
                                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                     (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                    auVar70 = vrcpps_avx(auVar91);
                                    auVar173._8_4_ = 0x3f800000;
                                    auVar173._0_8_ = 0x3f8000003f800000;
                                    auVar173._12_4_ = 0x3f800000;
                                    auVar90 = vfnmadd213ps_fma(auVar91,auVar70,auVar173);
                                    auVar70 = vfmadd132ps_fma(auVar90,auVar70,auVar70);
                                    fVar89 = auVar70._0_4_;
                                    auVar54._0_4_ = fVar89 * auVar120._0_4_;
                                    fVar100 = auVar70._4_4_;
                                    auVar54._4_4_ = fVar100 * auVar120._4_4_;
                                    fVar102 = auVar70._8_4_;
                                    auVar54._8_4_ = fVar102 * auVar120._8_4_;
                                    fVar104 = auVar70._12_4_;
                                    auVar54._12_4_ = fVar104 * auVar120._12_4_;
                                    auVar70 = vminps_avx(auVar54,auVar173);
                                    auVar122._0_4_ = fVar89 * auVar161._0_4_;
                                    auVar122._4_4_ = fVar100 * auVar161._4_4_;
                                    auVar122._8_4_ = fVar102 * auVar161._8_4_;
                                    auVar122._12_4_ = fVar104 * auVar161._12_4_;
                                    auVar90 = vminps_avx(auVar122,auVar173);
                                    auVar91 = vsubps_avx(auVar173,auVar70);
                                    auVar110 = vsubps_avx(auVar173,auVar90);
                                    auVar14._8_8_ = uVar19;
                                    auVar14._0_8_ = uVar18;
                                    auVar180 = ZEXT1664(auVar14);
                                    auVar70 = vblendvps_avx(auVar70,auVar91,auVar14);
                                    vblendvps_avx(auVar90,auVar110,auVar14);
                                    local_19d8 = auVar112._0_8_;
                                    uStack_19d0 = auVar112._8_8_;
                                    p0.field_0._0_8_ = local_19d8;
                                    p0.field_0._8_8_ = uStack_19d0;
                                    local_19e8 = auVar113._0_8_;
                                    uStack_19e0 = auVar113._8_8_;
                                    p0.field_0._16_8_ = local_19e8;
                                    p0.field_0._24_8_ = uStack_19e0;
                                    p0.field_0._32_16_ = auVar139;
                                    vpcmpeqd_avx2(ZEXT1632(auVar70),ZEXT1632(auVar70));
                                    auVar64._0_4_ = fVar89 * auVar148._0_4_;
                                    auVar64._4_4_ = fVar100 * auVar148._4_4_;
                                    auVar64._8_4_ = fVar102 * auVar148._8_4_;
                                    auVar64._12_4_ = fVar104 * auVar148._12_4_;
                                    auVar70 = vblendvps_avx(auVar111,auVar64,
                                                            (undefined1  [16])aVar87);
                                    *(undefined1 (*) [16])(ray + 0x80) = auVar70;
                                    itime.field_0 = aVar87;
                                    p1.field_0._0_8_ = &itime;
                                    p1.field_0._8_8_ = pGVar4->userPtr;
                                    p1.field_0._16_8_ = context->user;
                                    p1.field_0._24_8_ = ray;
                                    p1.field_0._32_8_ = &p0;
                                    p1.field_0._40_4_ = 4;
                                    if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                      auVar180 = ZEXT1664(auVar14);
                                      auVar185 = ZEXT1664(auVar55);
                                      in_ZMM13 = ZEXT1664(auVar140);
                                      (*pGVar4->occlusionFilterN)
                                                ((RTCFilterFunctionNArguments *)&p1);
                                    }
                                    if (itime.field_0 ==
                                        (anon_union_16_2_9473010e_for_vint_impl<4>_1)0x0) {
                                      auVar55 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                                      auVar55 = auVar55 ^ _DAT_01f7ae20;
                                    }
                                    else {
                                      p_Var6 = context->args->filter;
                                      if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                                         (((context->args->flags &
                                           RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                          (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                                        auVar180 = ZEXT1664(auVar180._0_16_);
                                        auVar185 = ZEXT1664(auVar185._0_16_);
                                        in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                                        (*p_Var6)((RTCFilterFunctionNArguments *)&p1);
                                      }
                                      auVar70 = vpcmpeqd_avx((undefined1  [16])itime.field_0,
                                                             _DAT_01f7aa10);
                                      auVar55 = auVar70 ^ _DAT_01f7ae20;
                                      auVar79._8_4_ = 0xff800000;
                                      auVar79._0_8_ = 0xff800000ff800000;
                                      auVar79._12_4_ = 0xff800000;
                                      auVar70 = vblendvps_avx(auVar79,*(undefined1 (*) [16])
                                                                       (p1.field_0._24_8_ + 0x80),
                                                              auVar70);
                                      *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80) = auVar70;
                                    }
                                    auVar55 = vpslld_avx(auVar55,0x1f);
                                    aVar87 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                             vpsrad_avx(auVar55,0x1f);
                                    auVar55 = vblendvps_avx(auVar111,*(undefined1 (*) [16])pRVar1,
                                                            auVar55);
                                    *(undefined1 (*) [16])pRVar1 = auVar55;
                                    auVar112 = auVar111;
                                  }
                                  auVar71 = vpandn_avx((undefined1  [16])aVar87,auVar71);
                                }
                              }
                            }
                            auVar215 = ZEXT1664(CONCAT412(0x7f800000,
                                                          CONCAT48(0x7f800000,0x7f8000007f800000)));
                            auVar81 = ZEXT1664(auVar71);
                            goto LAB_004e24d6;
                          }
                        }
                        auVar215 = ZEXT1664(CONCAT412(0x7f800000,
                                                      CONCAT48(0x7f800000,0x7f8000007f800000)));
                        auVar185 = ZEXT1664(auVar70);
                        auVar81 = ZEXT1664(auVar71);
                      }
LAB_004e24d6:
                      auVar71 = auVar81._0_16_;
                      auVar55 = vpcmpeqd_avx(auVar112,auVar112);
                      auVar66 = ZEXT1664(auVar55);
                      if (((((auVar71 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                            (auVar71 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar71 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           -1 < auVar81[0xf]) || (bVar36 = 2 < uVar27, uVar27 = uVar27 + 1, bVar36))
                      break;
                    }
                    auVar55 = auVar66._0_16_;
                    auVar70 = vandps_avx(auVar71,auVar72);
                    auVar72 = auVar72 & auVar71;
                  } while (((((auVar72 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar72 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar72 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            auVar72[0xf] < '\0') &&
                          (uVar25 = uVar25 + 1, auVar72 = auVar70, uVar25 < uVar24 - 8));
                  terminated.field_0.i[0] = auVar70._0_4_ ^ auVar66._0_4_;
                  terminated.field_0.i[1] = auVar70._4_4_ ^ auVar66._4_4_;
                  terminated.field_0.i[2] = auVar70._8_4_ ^ auVar66._8_4_;
                  terminated.field_0.i[3] = auVar70._12_4_ ^ auVar66._12_4_;
                }
                terminated.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                     vpor_avx((undefined1  [16])vVar20.field_0,(undefined1  [16])terminated.field_0)
                ;
                auVar55 = auVar55 & ~(undefined1  [16])terminated.field_0;
                if ((((auVar55 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar55 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar55 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar55[0xf]) goto LAB_004e31c3;
                auVar80._8_4_ = 0xff800000;
                auVar80._0_8_ = 0xff800000ff800000;
                auVar80._12_4_ = 0xff800000;
                aVar2.v = (__m128)vblendvps_avx(tray.tfar.field_0,auVar80,
                                                (undefined1  [16])terminated.field_0);
                auVar55 = vpcmpeqd_avx((undefined1  [16])tray.tfar.field_0,
                                       (undefined1  [16])tray.tfar.field_0);
                auVar66 = ZEXT1664(auVar55);
                tray.tfar.field_0 = aVar2;
              }
              goto LAB_004e1d8f;
            }
            uVar24 = root.ptr & 0xfffffffffffffff0;
            auVar55 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar81._0_16_,6);
            lVar26 = -0x10;
            root.ptr = 8;
            auVar72 = auVar215._0_16_;
            do {
              sVar3 = *(size_t *)(uVar24 + 0x20 + lVar26 * 2);
              if (sVar3 == 8) {
                auVar81 = ZEXT1664(auVar72);
                break;
              }
              uVar22 = *(undefined4 *)(uVar24 + 0x90 + lVar26);
              auVar92._4_4_ = uVar22;
              auVar92._0_4_ = uVar22;
              auVar92._8_4_ = uVar22;
              auVar92._12_4_ = uVar22;
              uVar22 = *(undefined4 *)(uVar24 + 0x30 + lVar26);
              auVar82._4_4_ = uVar22;
              auVar82._0_4_ = uVar22;
              auVar82._8_4_ = uVar22;
              auVar82._12_4_ = uVar22;
              auVar71 = *(undefined1 (*) [16])(ray + 0x70);
              auVar70 = vfmadd231ps_fma(auVar82,auVar71,auVar92);
              uVar22 = *(undefined4 *)(uVar24 + 0xb0 + lVar26);
              auVar112._4_4_ = uVar22;
              auVar112._0_4_ = uVar22;
              auVar112._8_4_ = uVar22;
              auVar112._12_4_ = uVar22;
              uVar22 = *(undefined4 *)(uVar24 + 0x50 + lVar26);
              auVar93._4_4_ = uVar22;
              auVar93._0_4_ = uVar22;
              auVar93._8_4_ = uVar22;
              auVar93._12_4_ = uVar22;
              auVar90 = vfmadd231ps_fma(auVar93,auVar71,auVar112);
              uVar22 = *(undefined4 *)(uVar24 + 0xd0 + lVar26);
              auVar139._4_4_ = uVar22;
              auVar139._0_4_ = uVar22;
              auVar139._8_4_ = uVar22;
              auVar139._12_4_ = uVar22;
              uVar22 = *(undefined4 *)(uVar24 + 0x70 + lVar26);
              auVar113._4_4_ = uVar22;
              auVar113._0_4_ = uVar22;
              auVar113._8_4_ = uVar22;
              auVar113._12_4_ = uVar22;
              auVar91 = vfmadd231ps_fma(auVar113,auVar71,auVar139);
              uVar22 = *(undefined4 *)(uVar24 + 0xa0 + lVar26);
              auVar153._4_4_ = uVar22;
              auVar153._0_4_ = uVar22;
              auVar153._8_4_ = uVar22;
              auVar153._12_4_ = uVar22;
              uVar22 = *(undefined4 *)(uVar24 + 0x40 + lVar26);
              auVar140._4_4_ = uVar22;
              auVar140._0_4_ = uVar22;
              auVar140._8_4_ = uVar22;
              auVar140._12_4_ = uVar22;
              auVar110 = vfmadd231ps_fma(auVar140,auVar71,auVar153);
              uVar22 = *(undefined4 *)(uVar24 + 0xc0 + lVar26);
              auVar154._4_4_ = uVar22;
              auVar154._0_4_ = uVar22;
              auVar154._8_4_ = uVar22;
              auVar154._12_4_ = uVar22;
              uVar22 = *(undefined4 *)(uVar24 + 0x60 + lVar26);
              auVar166._4_4_ = uVar22;
              auVar166._0_4_ = uVar22;
              auVar166._8_4_ = uVar22;
              auVar166._12_4_ = uVar22;
              auVar111 = vfmadd231ps_fma(auVar166,auVar71,auVar154);
              uVar22 = *(undefined4 *)(uVar24 + 0xe0 + lVar26);
              auVar155._4_4_ = uVar22;
              auVar155._0_4_ = uVar22;
              auVar155._8_4_ = uVar22;
              auVar155._12_4_ = uVar22;
              uVar22 = *(undefined4 *)(uVar24 + 0x80 + lVar26);
              auVar177._4_4_ = uVar22;
              auVar177._0_4_ = uVar22;
              auVar177._8_4_ = uVar22;
              auVar177._12_4_ = uVar22;
              auVar181 = vfmadd231ps_fma(auVar177,auVar71,auVar155);
              auVar10._4_4_ = tray.org_rdir.field_0._4_4_;
              auVar10._0_4_ = tray.org_rdir.field_0._0_4_;
              auVar10._8_4_ = tray.org_rdir.field_0._8_4_;
              auVar10._12_4_ = tray.org_rdir.field_0._12_4_;
              auVar182 = vfmsub213ps_fma(auVar70,(undefined1  [16])
                                                 tray.rdir.field_0.field_0.x.field_0,auVar10);
              auVar70._4_4_ = tray.org_rdir.field_0._20_4_;
              auVar70._0_4_ = tray.org_rdir.field_0._16_4_;
              auVar70._8_4_ = tray.org_rdir.field_0._24_4_;
              auVar70._12_4_ = tray.org_rdir.field_0._28_4_;
              in_ZMM13 = ZEXT1664(auVar70);
              auVar82 = vfmsub213ps_fma(auVar90,(undefined1  [16])
                                                tray.rdir.field_0.field_0.y.field_0,auVar70);
              auVar11._4_4_ = tray.org_rdir.field_0._36_4_;
              auVar11._0_4_ = tray.org_rdir.field_0._32_4_;
              auVar11._8_4_ = tray.org_rdir.field_0._40_4_;
              auVar11._12_4_ = tray.org_rdir.field_0._44_4_;
              auVar92 = vfmsub213ps_fma(auVar91,(undefined1  [16])
                                                tray.rdir.field_0.field_0.z.field_0,auVar11);
              auVar91 = vfmsub213ps_fma(auVar110,(undefined1  [16])
                                                 tray.rdir.field_0.field_0.x.field_0,auVar10);
              auVar110 = vfmsub213ps_fma(auVar111,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.y.field_0,auVar70);
              auVar111 = vfmsub213ps_fma(auVar181,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.z.field_0,auVar11);
              auVar180 = ZEXT1664(auVar111);
              auVar70 = vpminsd_avx(auVar182,auVar91);
              auVar90 = vpminsd_avx(auVar82,auVar110);
              auVar70 = vpmaxsd_avx(auVar70,auVar90);
              auVar90 = vpminsd_avx(auVar92,auVar111);
              auVar185 = ZEXT1664(auVar90);
              auVar70 = vpmaxsd_avx(auVar70,auVar90);
              auVar90 = vpmaxsd_avx(auVar182,auVar91);
              auVar91 = vpmaxsd_avx(auVar82,auVar110);
              auVar110 = vpminsd_avx(auVar90,auVar91);
              auVar90 = vpmaxsd_avx(auVar92,auVar111);
              auVar91 = vpmaxsd_avx(auVar70,(undefined1  [16])tray.tnear.field_0);
              auVar90 = vpminsd_avx(auVar110,auVar90);
              auVar90 = vpminsd_avx(auVar90,(undefined1  [16])tray.tfar.field_0);
              if ((uVar21 & 7) == 6) {
                auVar90 = vcmpps_avx(auVar91,auVar90,2);
                uVar22 = *(undefined4 *)(uVar24 + 0xf0 + lVar26);
                auVar94._4_4_ = uVar22;
                auVar94._0_4_ = uVar22;
                auVar94._8_4_ = uVar22;
                auVar94._12_4_ = uVar22;
                auVar91 = vcmpps_avx(auVar94,auVar71,2);
                uVar22 = *(undefined4 *)(uVar24 + 0x100 + lVar26);
                auVar114._4_4_ = uVar22;
                auVar114._0_4_ = uVar22;
                auVar114._8_4_ = uVar22;
                auVar114._12_4_ = uVar22;
                auVar71 = vcmpps_avx(auVar71,auVar114,1);
                auVar71 = vandps_avx(auVar91,auVar71);
                auVar71 = vandps_avx(auVar71,auVar90);
              }
              else {
                auVar71 = vcmpps_avx(auVar91,auVar90,2);
              }
              auVar71 = vandps_avx(auVar71,auVar55);
              auVar71 = vpslld_avx(auVar71,0x1f);
              if ((((auVar71 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar71 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar71 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar71[0xf]) {
                auVar81 = ZEXT1664(auVar72);
                sVar3 = root.ptr;
              }
              else {
                auVar71 = vblendvps_avx(auVar215._0_16_,auVar70,auVar71);
                auVar81 = ZEXT1664(auVar71);
                if (root.ptr != 8) {
                  pNVar35->ptr = root.ptr;
                  pNVar35 = pNVar35 + 1;
                  *(undefined1 (*) [16])paVar34->v = auVar72;
                  paVar34 = paVar34 + 1;
                }
              }
              root.ptr = sVar3;
              auVar72 = auVar81._0_16_;
              lVar26 = lVar26 + 4;
            } while (lVar26 != 0);
            if (root.ptr == 8) {
              iVar23 = 4;
              auVar55 = vpcmpeqd_avx(auVar72,auVar72);
              auVar66 = ZEXT1664(auVar55);
              goto LAB_004e30f1;
            }
            auVar55 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,
                                 (undefined1  [16])auVar81._0_16_,6);
            uVar22 = vmovmskps_avx(auVar55);
            auVar55 = vpcmpeqd_avx(auVar72,auVar72);
            auVar66 = ZEXT1664(auVar55);
          } while ((byte)uVar31 < (byte)POPCOUNT(uVar22));
          pNVar35->ptr = root.ptr;
          pNVar35 = pNVar35 + 1;
          *paVar34 = auVar81._0_16_;
          paVar34 = paVar34 + 1;
          iVar23 = 4;
        }
        else {
          do {
            sVar3 = 0;
            for (uVar25 = uVar24; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
              sVar3 = sVar3 + 1;
            }
            auVar66 = ZEXT1664(auVar66._0_16_);
            auVar180 = ZEXT1664(auVar180._0_16_);
            auVar185 = ZEXT1664(auVar185._0_16_);
            in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
            bVar36 = occluded1(This,bvh,root,sVar3,&pre,ray,&tray,context);
            if (bVar36) {
              terminated.field_0.i[sVar3] = -1;
            }
            uVar24 = uVar24 - 1 & uVar24;
          } while (uVar24 != 0);
          auVar55 = vpcmpeqd_avx(auVar66._0_16_,auVar66._0_16_);
          auVar72 = auVar55 & ~(undefined1  [16])terminated.field_0;
          iVar23 = 3;
          if ((((auVar72 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar72 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar72 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar72[0xf] < '\0') {
            auVar55._8_4_ = 0xff800000;
            auVar55._0_8_ = 0xff800000ff800000;
            auVar55._12_4_ = 0xff800000;
            aVar7.v = (__m128)vblendvps_avx(tray.tfar.field_0,auVar55,
                                            (undefined1  [16])terminated.field_0);
            auVar55 = vpcmpeqd_avx((undefined1  [16])tray.tfar.field_0,
                                   (undefined1  [16])tray.tfar.field_0);
            tray.tfar.field_0 = aVar7;
            iVar23 = 2;
          }
          auVar66 = ZEXT1664(auVar55);
          auVar215 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          if (uVar31 < uVar21) goto LAB_004e1dcd;
        }
LAB_004e30f1:
      } while (iVar23 != 3);
LAB_004e31c3:
      auVar8 = vandps_avx(auVar8,(undefined1  [16])terminated.field_0);
      auVar65._8_4_ = 0xff800000;
      auVar65._0_8_ = 0xff800000ff800000;
      auVar65._12_4_ = 0xff800000;
      auVar8 = vmaskmovps_avx(auVar8,auVar65);
      *(undefined1 (*) [16])pRVar1 = auVar8;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }